

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

ref<immutable::rrb<int,_false,_6>_> __thiscall
immutable::rrb_details::rrb_drop_left<int,false,6>
          (rrb_details *this,ref<immutable::rrb<int,_false,_6>_> *in,uint32_t left)

{
  ref<immutable::rrb_details::tree_node<int,_false>_> *prVar1;
  ref<immutable::rrb_details::tree_node<int,_false>_> *__s;
  uint uVar2;
  leaf_node<int,_false> *plVar3;
  int *piVar4;
  tree_node<int,_false> *ptVar5;
  long lVar6;
  ref<immutable::rrb<int,_false,_6>_> rVar7;
  uint uVar8;
  rrb<int,_false,_6> *temp;
  rrb<int,_false,_6> *prVar9;
  undefined8 *puVar10;
  rrb<int,_false,_6> *prVar11;
  rrb<int,_false,_6> *prVar12;
  ulong uVar13;
  char *__function;
  ulong uVar14;
  uint32_t uVar15;
  tree_node<int,_false> *temp_1;
  uint uVar16;
  ref<immutable::rrb<int,_false,_6>_> new_rrb;
  ref<immutable::rrb<int,_false,_6>_> local_68;
  ref<immutable::rrb<int,_false,_6>_> local_60;
  rrb<int,_false,_6> *local_58;
  rrb<int,_false,_6> *local_50;
  ulong local_48;
  rrb<int,_false,_6> *local_40;
  ref<immutable::rrb_details::tree_node<int,_false>_> local_38;
  
  prVar9 = in->ptr;
  if (prVar9 == (rrb<int,_false,_6> *)0x0) goto LAB_00147bfc;
  uVar16 = prVar9->cnt;
  uVar8 = uVar16 - left;
  if (uVar16 < left || uVar8 == 0) {
    puVar10 = (undefined8 *)malloc(0x28);
    *puVar10 = 0;
    *(undefined4 *)(puVar10 + 1) = 0;
    puVar10[2] = 0;
    puVar10[3] = 0;
    local_60.ptr = (rrb<int,_false,_6> *)malloc(0x18);
    ((local_60.ptr)->tail).ptr = (leaf_node<int,_false> *)0x0;
    (local_60.ptr)->cnt = 0;
    (local_60.ptr)->shift = 0;
    *(undefined8 *)&(local_60.ptr)->tail_len = 1;
    ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=
              ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)(puVar10 + 2),
               (ref<immutable::rrb_details::leaf_node<int,_false>_> *)&local_60);
    if ((local_60.ptr != (rrb<int,_false,_6> *)0x0) &&
       (uVar15 = (local_60.ptr)->tail_len, (local_60.ptr)->tail_len = uVar15 - 1, uVar15 == 1)) {
      free(local_60.ptr);
    }
    *(undefined8 **)this = puVar10;
    *(undefined4 *)(puVar10 + 4) = 1;
    return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
  }
  if (left != 0) {
    uVar2 = prVar9->tail_len;
    local_58 = (rrb<int,_false,_6> *)this;
    if (uVar8 <= uVar2) {
      uVar14 = (ulong)uVar8;
      local_50 = (rrb<int,_false,_6> *)(uVar14 * 4);
      local_40 = prVar9;
      prVar9 = (rrb<int,_false,_6> *)malloc(uVar14 * 4 + 0x18);
      local_48 = CONCAT44(local_48._4_4_,uVar8);
      prVar9->shift = uVar8;
      prVar9->cnt = 0;
      (prVar9->tail).ptr = (leaf_node<int,_false> *)&prVar9->root;
      *(undefined4 *)&prVar9->field_0xc = 0;
      memset(&prVar9->root,0,(size_t)local_50);
      prVar9->tail_len = 1;
      plVar3 = (local_40->tail).ptr;
      local_68.ptr = prVar9;
      if (plVar3 != (leaf_node<int,_false> *)0x0) {
        piVar4 = plVar3->child;
        uVar13 = 0;
        do {
          *(int *)((long)&(prVar9->root).ptr + uVar13 * 4) =
               piVar4[((uVar2 + left) - uVar16) + (int)uVar13];
          uVar13 = uVar13 + 1;
        } while (uVar14 != uVar13);
        puVar10 = (undefined8 *)malloc(0x28);
        *puVar10 = 0;
        *(undefined4 *)(puVar10 + 1) = 0;
        puVar10[2] = 0;
        puVar10[3] = 0;
        local_60.ptr = (rrb<int,_false,_6> *)malloc(0x18);
        ((local_60.ptr)->tail).ptr = (leaf_node<int,_false> *)0x0;
        (local_60.ptr)->cnt = 0;
        (local_60.ptr)->shift = 0;
        *(undefined8 *)&(local_60.ptr)->tail_len = 1;
        ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=
                  ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)(puVar10 + 2),
                   (ref<immutable::rrb_details::leaf_node<int,_false>_> *)&local_60);
        if ((local_60.ptr != (rrb<int,_false,_6> *)0x0) &&
           (uVar15 = (local_60.ptr)->tail_len, (local_60.ptr)->tail_len = uVar15 - 1, uVar15 == 1))
        {
          free(local_60.ptr);
        }
        prVar9 = local_58;
        *(undefined8 **)local_58 = puVar10;
        *(undefined4 *)(puVar10 + 4) = 1;
        *(undefined4 *)puVar10 = (undefined4)local_48;
        *(undefined4 *)(puVar10 + 1) = (undefined4)local_48;
        ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=
                  ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)(puVar10 + 2),
                   (ref<immutable::rrb_details::leaf_node<int,_false>_> *)&local_68);
        if (local_68.ptr == (rrb<int,_false,_6> *)0x0) {
          return (ref<immutable::rrb<int,_false,_6>_>)prVar9;
        }
        uVar15 = (local_68.ptr)->tail_len;
        (local_68.ptr)->tail_len = uVar15 - 1;
        if (uVar15 != 1) {
          return (ref<immutable::rrb<int,_false,_6>_>)prVar9;
        }
        free(local_68.ptr);
        return (ref<immutable::rrb<int,_false,_6>_>)prVar9;
      }
      goto LAB_00147c1b;
    }
    prVar9 = (rrb<int,_false,_6> *)malloc(0x28);
    prVar9->cnt = 0;
    prVar9->shift = 0;
    prVar9->tail_len = 0;
    (prVar9->tail).ptr = (leaf_node<int,_false> *)0x0;
    (prVar9->root).ptr = (tree_node<int,_false> *)0x0;
    local_60.ptr = (rrb<int,_false,_6> *)malloc(0x18);
    ((local_60.ptr)->tail).ptr = (leaf_node<int,_false> *)0x0;
    (local_60.ptr)->cnt = 0;
    (local_60.ptr)->shift = 0;
    *(undefined8 *)&(local_60.ptr)->tail_len = 1;
    ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=
              (&prVar9->tail,(ref<immutable::rrb_details::leaf_node<int,_false>_> *)&local_60);
    if ((local_60.ptr != (rrb<int,_false,_6> *)0x0) &&
       (uVar15 = (local_60.ptr)->tail_len, (local_60.ptr)->tail_len = uVar15 - 1, uVar15 == 1)) {
      free(local_60.ptr);
    }
    this = (rrb_details *)local_58;
    prVar9->_ref_count = 1;
    prVar12 = in->ptr;
    local_68.ptr = prVar9;
    if (prVar12 != (rrb<int,_false,_6> *)0x0) {
      rrb_drop_left_rec<int,false,6>
                ((rrb_details *)&local_60,&prVar9->shift,&prVar12->root,left,prVar12->shift,false);
      rVar7.ptr = local_60.ptr;
      if (local_60.ptr != (rrb<int,_false,_6> *)0x0) {
        (local_60.ptr)->tail_len = (local_60.ptr)->tail_len + 1;
      }
      ref<immutable::rrb_details::tree_node<int,_false>_>::~ref
                ((ref<immutable::rrb_details::tree_node<int,_false>_> *)&local_60);
      if (local_68.ptr != (rrb<int,_false,_6> *)0x0) {
        (local_68.ptr)->cnt = uVar8;
        if (rVar7.ptr != (rrb<int,_false,_6> *)0x0) {
          (rVar7.ptr)->tail_len = (rVar7.ptr)->tail_len + 1;
        }
        local_60.ptr = (rrb<int,_false,_6> *)((local_68.ptr)->root).ptr;
        ((local_68.ptr)->root).ptr = (tree_node<int,_false> *)rVar7.ptr;
        ref<immutable::rrb_details::tree_node<int,_false>_>::~ref
                  ((ref<immutable::rrb_details::tree_node<int,_false>_> *)&local_60);
        if (local_68.ptr != (rrb<int,_false,_6> *)0x0) {
          if ((local_68.ptr)->shift == 0) {
            prVar9 = in->ptr;
LAB_00147895:
            if (prVar9 == (rrb<int,_false,_6> *)0x0) goto LAB_00147bfc;
          }
          else {
            if (rVar7.ptr == (rrb<int,_false,_6> *)0x0) {
              __function = 
              "T *immutable::ref<immutable::rrb_details::internal_node<int, false>>::operator->() const [T = immutable::rrb_details::internal_node<int, false>]"
              ;
              goto LAB_00147c11;
            }
            plVar3 = ((rVar7.ptr)->tail).ptr;
            prVar9 = in->ptr;
            if (plVar3 == (leaf_node<int,_false> *)0x0) goto LAB_00147895;
            if (prVar9 == (rrb<int,_false,_6> *)0x0) goto LAB_00147bfc;
            *(uint32_t *)(*(long *)plVar3 + (ulong)((rVar7.ptr)->shift - 1) * 4) =
                 (local_68.ptr)->cnt - prVar9->tail_len;
          }
          ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=
                    (&(local_68.ptr)->tail,&prVar9->tail);
          prVar9 = in->ptr;
          if ((prVar9 != (rrb<int,_false,_6> *)0x0) && (local_68.ptr != (rrb<int,_false,_6> *)0x0))
          {
            (local_68.ptr)->tail_len = prVar9->tail_len;
            (local_68.ptr)->_ref_count = (local_68.ptr)->_ref_count + 1;
            in->ptr = (rrb<int,_false,_6> *)local_68;
            local_60.ptr = prVar9;
            ref<immutable::rrb<int,_false,_6>_>::~ref(&local_60);
            release<int>((internal_node<int,_false> *)rVar7.ptr);
            ref<immutable::rrb<int,_false,_6>_>::~ref(&local_68);
            prVar9 = in->ptr;
            if (prVar9 != (rrb<int,_false,_6> *)0x0) goto LAB_001478f9;
          }
        }
      }
    }
    goto LAB_00147bfc;
  }
LAB_001478f9:
  if ((prVar9->shift != 0) ||
     (prVar12 = (rrb<int,_false,_6> *)(prVar9->root).ptr, prVar12 == (rrb<int,_false,_6> *)0x0))
  goto LAB_00147900;
  uVar16 = prVar9->cnt;
  uVar14 = (ulong)uVar16;
  local_58 = (rrb<int,_false,_6> *)this;
  if (uVar14 < 0x41) {
    prVar11 = (rrb<int,_false,_6> *)malloc(uVar14 * 4 + 0x18);
    prVar11->shift = uVar16;
    prVar11->cnt = 0;
    prVar1 = &prVar11->root;
    (prVar11->tail).ptr = (leaf_node<int,_false> *)prVar1;
    *(undefined4 *)&prVar11->field_0xc = 0;
    if (uVar16 != 0) {
      memset(prVar1,0,uVar14 << 2);
    }
    prVar11->tail_len = 1;
    uVar8 = prVar12->shift;
    if ((ulong)uVar8 != 0) {
      plVar3 = (prVar12->tail).ptr;
      uVar14 = 0;
      do {
        *(node_type *)((long)&prVar1->ptr + uVar14 * 4) = (&plVar3->type)[uVar14];
        uVar14 = uVar14 + 1;
      } while (uVar14 < uVar8);
    }
    uVar2 = prVar9->tail_len;
    local_68.ptr = prVar11;
    if ((ulong)uVar2 != 0) {
      plVar3 = (prVar9->tail).ptr;
      if (plVar3 == (leaf_node<int,_false> *)0x0) {
LAB_00147c1b:
        __function = 
        "T *immutable::ref<immutable::rrb_details::leaf_node<int, false>>::operator->() const [T = immutable::rrb_details::leaf_node<int, false>]"
        ;
        goto LAB_00147c11;
      }
      piVar4 = plVar3->child;
      uVar14 = 0;
      do {
        *(int *)((long)&prVar1->ptr + (ulong)(uVar8 + (int)uVar14) * 4) = piVar4[uVar14];
        uVar14 = uVar14 + 1;
      } while (uVar14 < uVar2);
    }
    prVar9->tail_len = uVar16;
    local_38.ptr = (tree_node<int,_false> *)0x0;
    (prVar9->root).ptr = (tree_node<int,_false> *)0x0;
    local_60.ptr = prVar12;
    ref<immutable::rrb_details::tree_node<int,_false>_>::~ref
              ((ref<immutable::rrb_details::tree_node<int,_false>_> *)&local_60);
    ref<immutable::rrb_details::tree_node<int,_false>_>::~ref(&local_38);
    if (in->ptr != (rrb<int,_false,_6> *)0x0) {
      ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=
                (&in->ptr->tail,(ref<immutable::rrb_details::leaf_node<int,_false>_> *)&local_68);
      this = (rrb_details *)local_58;
      if (local_68.ptr == (rrb<int,_false,_6> *)0x0) goto LAB_00147900;
      uVar15 = (local_68.ptr)->tail_len;
      (local_68.ptr)->tail_len = uVar15 - 1;
      rVar7.ptr = local_68.ptr;
joined_r0x00147be9:
      if (uVar15 == 1) {
        free(rVar7.ptr);
      }
LAB_00147900:
      prVar9 = in->ptr;
      *(rrb<int,_false,_6> **)this = prVar9;
      if (prVar9 != (rrb<int,_false,_6> *)0x0) {
        prVar9->_ref_count = prVar9->_ref_count + 1;
      }
      return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
    }
  }
  else {
    if (0x3f < uVar16 - prVar9->tail_len) goto LAB_00147900;
    local_40 = (rrb<int,_false,_6> *)CONCAT44(local_40._4_4_,prVar12->shift);
    uVar16 = 0x40 - prVar12->shift;
    prVar12 = (rrb<int,_false,_6> *)malloc(0x118);
    prVar1 = &prVar12->root;
    (prVar12->tail).ptr = (leaf_node<int,_false> *)prVar1;
    memset(prVar1,0,0x100);
    prVar12->cnt = 0;
    prVar12->shift = 0x40;
    *(undefined8 *)&prVar12->tail_len = 1;
    uVar15 = prVar9->tail_len;
    local_48 = (ulong)(uVar15 - uVar16);
    local_50 = prVar12;
    prVar12 = (rrb<int,_false,_6> *)malloc(local_48 * 4 + 0x18);
    __s = &prVar12->root;
    uVar15 = uVar15 - uVar16;
    prVar12->shift = uVar15;
    prVar12->cnt = 0;
    (prVar12->tail).ptr = (leaf_node<int,_false> *)__s;
    *(undefined4 *)&prVar12->field_0xc = 0;
    if (uVar15 != 0) {
      memset(__s,0,local_48 << 2);
    }
    this = (rrb_details *)local_58;
    prVar12->tail_len = 1;
    ptVar5 = (prVar9->root).ptr;
    local_68.ptr = prVar12;
    if (ptVar5 == (tree_node<int,_false> *)0x0) {
      __function = 
      "T *immutable::ref<immutable::rrb_details::tree_node<int, false>>::operator->() const [T = immutable::rrb_details::tree_node<int, false>]"
      ;
      goto LAB_00147c11;
    }
    if (ptVar5->len != 0) {
      lVar6 = *(long *)(ptVar5 + 1);
      uVar14 = 0;
      do {
        *(undefined4 *)((long)&prVar1->ptr + uVar14 * 4) = *(undefined4 *)(lVar6 + uVar14 * 4);
        uVar14 = uVar14 + 1;
      } while (uVar14 < ptVar5->len);
    }
    if ((int)local_40 != 0x40) {
      plVar3 = (prVar9->tail).ptr;
      if (plVar3 == (leaf_node<int,_false> *)0x0) goto LAB_00147c1b;
      piVar4 = plVar3->child;
      uVar14 = 0;
      do {
        *(int *)((long)&prVar1->ptr + (ulong)(ptVar5->len + (int)uVar14) * 4) = piVar4[uVar14];
        uVar14 = uVar14 + 1;
      } while (uVar16 != uVar14);
    }
    uVar8 = 0;
    if (prVar9->tail_len != uVar16) {
      plVar3 = (prVar9->tail).ptr;
      if (plVar3 == (leaf_node<int,_false> *)0x0) goto LAB_00147c1b;
      piVar4 = plVar3->child;
      uVar14 = 0;
      do {
        *(int *)((long)&__s->ptr + uVar14 * 4) = piVar4[uVar16 + (int)uVar14];
        uVar14 = uVar14 + 1;
        uVar8 = prVar9->tail_len - uVar16;
      } while (uVar14 < uVar8);
    }
    prVar9->tail_len = uVar8;
    ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=
              (&prVar9->tail,(ref<immutable::rrb_details::leaf_node<int,_false>_> *)&local_68);
    rVar7.ptr = local_50;
    prVar9 = in->ptr;
    if (prVar9 != (rrb<int,_false,_6> *)0x0) {
      local_50->tail_len = local_50->tail_len + 1;
      local_60.ptr = (rrb<int,_false,_6> *)(prVar9->root).ptr;
      (prVar9->root).ptr = (tree_node<int,_false> *)local_50;
      ref<immutable::rrb_details::tree_node<int,_false>_>::~ref
                ((ref<immutable::rrb_details::tree_node<int,_false>_> *)&local_60);
      if ((local_68.ptr != (rrb<int,_false,_6> *)0x0) &&
         (uVar15 = (local_68.ptr)->tail_len, (local_68.ptr)->tail_len = uVar15 - 1, uVar15 == 1)) {
        free(local_68.ptr);
      }
      uVar15 = (rVar7.ptr)->tail_len;
      (rVar7.ptr)->tail_len = uVar15 - 1;
      goto joined_r0x00147be9;
    }
  }
LAB_00147bfc:
  __function = 
  "T *immutable::ref<immutable::rrb<int, false, 6>>::operator->() const [T = immutable::rrb<int, false, 6>]"
  ;
LAB_00147c11:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

T* ref<T>::operator->() const
      {
      assert(ptr != nullptr);
      return ptr;
      }